

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O0

void print_debug_tensor(ggml_tensor *t,bool with_data)

{
  undefined8 uVar1;
  byte in_SIL;
  undefined4 *in_RDI;
  float fVar2;
  size_t i;
  ulong local_18;
  
  uVar1 = ggml_type_name(*in_RDI);
  printf("%s: %s (%s): [%d, %d]\n","print_debug_tensor",in_RDI + 0x40,uVar1,
         *(ulong *)(in_RDI + 4) & 0xffffffff,*(ulong *)(in_RDI + 6) & 0xffffffff);
  if ((in_SIL & 1) != 0) {
    printf("%s: %s[0] = [","print_debug_tensor",in_RDI + 0x40);
    for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
      fVar2 = (float)ggml_get_f32_nd(in_RDI,local_18 & 0xffffffff,0,0);
      printf(" %f,",(double)fVar2);
    }
    printf(" ... ]\n");
  }
  return;
}

Assistant:

static void print_debug_tensor(struct ggml_tensor * t, bool with_data = true) {
    printf("%s: %s (%s): [%d, %d]\n", __func__, t->name, ggml_type_name(t->type), (int) t->ne[0], (int) t->ne[1]);
    if (!with_data) return;
    printf("%s: %s[0] = [", __func__, t->name);
    for (size_t i = 0; i <= DEBUG_POS; i++) {
        printf(" %f,", ggml_get_f32_nd(t, i, 0, 0, 0));
    }
    printf(" ... ]\n");
}